

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

char fsnav_init_gnss_glo(fsnav_gnss_glo *glo,size_t max_sat_count,size_t max_eph_count)

{
  undefined8 *puVar1;
  char cVar2;
  fsnav_gnss_sat *pfVar3;
  int *piVar4;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  
  pfVar3 = (fsnav_gnss_sat *)calloc(max_sat_count,0x90);
  glo->sat = (fsnav_gnss_sat *)0x0;
  glo->freq_slot = (int *)0x0;
  glo->max_sat_count = 0;
  glo->max_eph_count = 0;
  glo->sat = pfVar3;
  if (pfVar3 == (fsnav_gnss_sat *)0x0) {
LAB_00106697:
    cVar2 = '\0';
  }
  else {
    piVar4 = (int *)calloc(max_sat_count,4);
    glo->freq_slot = piVar4;
    glo->max_sat_count = max_sat_count;
    if (max_sat_count != 0) {
      lVar5 = 0x80;
      uVar7 = 0;
      do {
        pfVar3 = glo->sat;
        *(undefined8 *)((long)pfVar3 + lVar5 + -0x80) = 0;
        *(undefined1 *)((long)pfVar3 + lVar5 + -0x78) = 0;
        *(undefined8 *)((long)pfVar3 + lVar5 + -0x70) = 0;
        *(undefined1 *)((long)pfVar3->x + lVar5 + -0x68) = 0;
        *(undefined1 *)((long)pfVar3->x + lVar5 + -0x48) = 0;
        *(undefined1 *)((long)pfVar3 + lVar5 + -0x58) = 0;
        *(undefined1 *)((long)pfVar3->x + lVar5 + -0x38) = 0;
        puVar1 = (undefined8 *)((long)pfVar3->x + lVar5 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        uVar7 = uVar7 + 1;
        max_sat_count = glo->max_sat_count;
        lVar5 = lVar5 + 0x90;
      } while (uVar7 < max_sat_count);
    }
    if (max_sat_count != 0) {
      pfVar3 = glo->sat;
      do {
        pdVar6 = (double *)calloc(max_eph_count,8);
        pfVar3->eph = pdVar6;
        if (pdVar6 == (double *)0x0) goto LAB_00106697;
        pfVar3 = pfVar3 + 1;
        max_sat_count = max_sat_count - 1;
      } while (max_sat_count != 0);
    }
    glo->max_eph_count = max_eph_count;
    glo->obs_types = (char (*) [4])0x0;
    glo->obs_count = 0;
    cVar2 = '\x01';
  }
  return cVar2;
}

Assistant:

char fsnav_init_gnss_glo(fsnav_gnss_glo* glo, const size_t max_sat_count, const size_t max_eph_count)
{
	size_t i;

	glo->sat = NULL;
	glo->freq_slot = NULL;
	glo->max_sat_count = 0;
	glo->max_eph_count = 0;

	// try to allocate memory for satellite data
	glo->sat = (fsnav_gnss_sat*)calloc(max_sat_count, sizeof(fsnav_gnss_sat));
	if (glo->sat == NULL)
		return 0;
	glo->freq_slot = (int*)calloc(max_sat_count, sizeof(int));
	glo->max_sat_count = max_sat_count;

	// initialize satellite data
	for (i = 0; i < glo->max_sat_count; i++)
		fsnav_init_gnss_sat(glo->sat + i);

	// try to allocate memory for each satellite ephemeris
	for (i = 0; i < glo->max_sat_count; i++) {
		glo->sat[i].eph = (double*)calloc(max_eph_count, sizeof(double));
		if (glo->sat[i].eph == NULL)
			return 0;
	}
	glo->max_eph_count = max_eph_count;

	// observation types
	glo->obs_types = NULL;
	glo->obs_count = 0;

	return 1;
}